

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeGetQuadSens1(void *cvode_mem,sunrealtype *tret,int is,N_Vector yQSout)

{
  undefined8 *in_RSI;
  long in_RDI;
  int flag;
  N_Vector unaff_retaddr;
  CVodeMem cv_mem;
  undefined4 in_stack_00000018;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x1061,"CVodeGetQuadSens1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x410);
    local_4 = CVodeGetQuadSensDky1
                        ((void *)CONCAT44(is,in_stack_00000018),(sunrealtype)yQSout,cv_mem._4_4_,
                         (int)cv_mem,unaff_retaddr);
  }
  return local_4;
}

Assistant:

int CVodeGetQuadSens1(void* cvode_mem, sunrealtype* tret, int is, N_Vector yQSout)
{
  CVodeMem cv_mem;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  *tret = cv_mem->cv_tretlast;

  flag = CVodeGetQuadSensDky1(cvode_mem, cv_mem->cv_tretlast, 0, is, yQSout);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}